

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O1

aom_codec_err_t
aom_film_grain_table_read
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  int *piVar1;
  aom_film_grain_table_entry_t *paVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  aom_film_grain_table_entry_t *__s;
  char *pcVar6;
  aom_film_grain_table_entry_t *paVar7;
  int (*paiVar8) [2];
  int *piVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  char magic [9];
  
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to open %s",filename);
  }
  else {
    error_info->error_code = AOM_CODEC_OK;
    sVar5 = fread(magic,9,1,__stream);
    if ((sVar5 == 0) || (magic._0_8_ != 0x316e72676d6c6966)) {
      aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to read (or invalid) file magic");
    }
    else {
      paVar7 = (aom_film_grain_table_entry_t *)0x0;
      do {
        iVar3 = feof(__stream);
        if (iVar3 != 0) break;
        __s = (aom_film_grain_table_entry_t *)aom_malloc(0x2a0);
        if (__s == (aom_film_grain_table_entry_t *)0x0) {
          bVar12 = false;
          aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,"Unable to allocate grain table entry");
        }
        else {
          memset(__s,0,0x2a0);
          piVar9 = &(__s->params).update_parameters;
          uVar4 = __isoc99_fscanf(__stream,"E %ld %ld %d %hd %d\n",&__s->start_time,&__s->end_time,
                                  __s,&(__s->params).random_seed,piVar9);
          if (uVar4 == 5) {
            if (*piVar9 != 0) {
              piVar9 = &(__s->params).ar_coeff_lag;
              uVar4 = __isoc99_fscanf(__stream,"p %d %d %d %d %d %d %d %d %d %d %d %d\n",piVar9,
                                      &(__s->params).ar_coeff_shift,&(__s->params).grain_scale_shift
                                      ,&(__s->params).scaling_shift,
                                      &(__s->params).chroma_scaling_from_luma,
                                      &(__s->params).overlap_flag,&(__s->params).cb_mult,
                                      &(__s->params).cb_luma_mult,&(__s->params).cb_offset,
                                      &(__s->params).cr_mult,&(__s->params).cr_luma_mult,
                                      &(__s->params).cr_offset);
              if (uVar4 == 0xc) {
                piVar1 = &(__s->params).num_y_points;
                iVar3 = __isoc99_fscanf(__stream,"\tsY %d ",piVar1);
                if (iVar3 == 0) {
                  pcVar6 = "Unable to read num y points";
LAB_0016866a:
                  aom_internal_error(error_info,AOM_CODEC_ERROR,pcVar6);
                }
                else {
                  if (0 < *piVar1) {
                    lVar10 = 0;
                    paVar2 = __s;
                    do {
                      paiVar8 = (paVar2->params).scaling_points_y;
                      iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar8,
                                              (paVar2->params).scaling_points_y[0] + 1);
                      if (iVar3 != 2) {
                        pcVar6 = "Unable to read y scaling points";
                        goto LAB_0016866a;
                      }
                      lVar10 = lVar10 + 1;
                      paVar2 = (aom_film_grain_table_entry_t *)paiVar8;
                    } while (lVar10 < *piVar1);
                  }
                  piVar1 = &(__s->params).num_cb_points;
                  iVar3 = __isoc99_fscanf(__stream,"\n\tsCb %d",piVar1);
                  if (iVar3 == 0) {
                    pcVar6 = "Unable to read num cb points";
                  }
                  else {
                    if (0 < *piVar1) {
                      paiVar8 = (__s->params).scaling_points_cb;
                      lVar10 = 0;
                      do {
                        iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar8,*paiVar8 + 1);
                        if (iVar3 != 2) {
                          pcVar6 = "Unable to read cb scaling points";
                          goto LAB_0016866a;
                        }
                        lVar10 = lVar10 + 1;
                        paiVar8 = paiVar8 + 1;
                      } while (lVar10 < *piVar1);
                    }
                    piVar1 = &(__s->params).num_cr_points;
                    iVar3 = __isoc99_fscanf(__stream,"\n\tsCr %d",piVar1);
                    if (iVar3 == 0) {
                      pcVar6 = "Unable to read num cr points";
                    }
                    else {
                      if (0 < *piVar1) {
                        paiVar8 = (__s->params).scaling_points_cr;
                        lVar10 = 0;
                        do {
                          iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar8,*paiVar8 + 1);
                          if (iVar3 != 2) {
                            pcVar6 = "Unable to read cr scaling points";
                            goto LAB_0016866a;
                          }
                          lVar10 = lVar10 + 1;
                          paiVar8 = paiVar8 + 1;
                        } while (lVar10 < *piVar1);
                      }
                      iVar3 = __isoc99_fscanf(__stream,"\n\tcY");
                      if (iVar3 == 0) {
                        iVar3 = *piVar9;
                        uVar4 = (iVar3 + 1) * iVar3 * 2;
                        if (0 < (int)uVar4) {
                          piVar9 = (__s->params).ar_coeffs_y;
                          uVar11 = (ulong)uVar4;
                          do {
                            iVar3 = __isoc99_fscanf(__stream,"%d",piVar9);
                            if (iVar3 != 1) {
                              pcVar6 = "Unable to read Y coeffs";
                              goto LAB_0016866a;
                            }
                            piVar9 = piVar9 + 1;
                            uVar11 = uVar11 - 1;
                          } while (uVar11 != 0);
                        }
                        iVar3 = __isoc99_fscanf(__stream,"\n\tcCb");
                        if (iVar3 == 0) {
                          if (-1 < (int)uVar4) {
                            piVar9 = (__s->params).ar_coeffs_cb;
                            lVar10 = (ulong)uVar4 + 1;
                            do {
                              iVar3 = __isoc99_fscanf(__stream,"%d",piVar9);
                              if (iVar3 != 1) {
                                pcVar6 = "Unable to read Cb coeffs";
                                goto LAB_001685bb;
                              }
                              piVar9 = piVar9 + 1;
                              lVar10 = lVar10 + -1;
                            } while (lVar10 != 0);
                          }
                          iVar3 = __isoc99_fscanf(__stream,"\n\tcCr");
                          if (iVar3 == 0) {
                            if (-1 < (int)uVar4) {
                              piVar9 = (__s->params).ar_coeffs_cr;
                              lVar10 = (ulong)uVar4 + 1;
                              do {
                                iVar3 = __isoc99_fscanf(__stream,"%d",piVar9);
                                if (iVar3 != 1) {
                                  pcVar6 = "Unable to read Cr coeffs";
                                  goto LAB_001685bb;
                                }
                                piVar9 = piVar9 + 1;
                                lVar10 = lVar10 + -1;
                              } while (lVar10 != 0);
                            }
                            __isoc99_fscanf(__stream);
                            goto LAB_00168676;
                          }
                          pcVar6 = "Unable read to Cr coeffs header (cCr)";
                        }
                        else {
                          pcVar6 = "Unable to read Cb coeffs header (cCb)";
                        }
                      }
                      else {
                        pcVar6 = "Unable to read Y coeffs header (cY)";
                      }
                    }
                  }
LAB_001685bb:
                  aom_internal_error(error_info,AOM_CODEC_ERROR,pcVar6);
                }
              }
              else {
                aom_internal_error(error_info,AOM_CODEC_ERROR,
                                   "Unable to read entry params. Read %d != 12",(ulong)uVar4);
              }
            }
          }
          else if ((uVar4 != 0) || (iVar3 = feof(__stream), iVar3 == 0)) {
            aom_internal_error(error_info,AOM_CODEC_ERROR,
                               "Unable to read entry header. Read %d != 5",(ulong)uVar4);
          }
LAB_00168676:
          __s->next = (aom_film_grain_table_entry_t *)0x0;
          if (paVar7 != (aom_film_grain_table_entry_t *)0x0) {
            paVar7->next = __s;
          }
          if (t->head == (aom_film_grain_table_entry_t *)0x0) {
            t->head = __s;
          }
          t->tail = __s;
          bVar12 = error_info->error_code == AOM_CODEC_OK;
          paVar7 = __s;
        }
      } while (bVar12);
    }
    fclose(__stream);
  }
  return error_info->error_code;
}

Assistant:

aom_codec_err_t aom_film_grain_table_read(
    aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  FILE *file = fopen(filename, "rb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open %s",
                       filename);
    return error_info->error_code;
  }
  error_info->error_code = AOM_CODEC_OK;

  // Read in one extra character as there should be white space after
  // the header.
  char magic[9];
  if (!fread(magic, 9, 1, file) || memcmp(magic, kFileMagic, 8)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to read (or invalid) file magic");
    fclose(file);
    return error_info->error_code;
  }

  aom_film_grain_table_entry_t *prev_entry = NULL;
  while (!feof(file)) {
    aom_film_grain_table_entry_t *entry = aom_malloc(sizeof(*entry));
    if (!entry) {
      aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                         "Unable to allocate grain table entry");
      break;
    }
    memset(entry, 0, sizeof(*entry));
    grain_table_entry_read(file, error_info, entry);
    entry->next = NULL;

    if (prev_entry) prev_entry->next = entry;
    if (!t->head) t->head = entry;
    t->tail = entry;
    prev_entry = entry;

    if (error_info->error_code != AOM_CODEC_OK) break;
  }

  fclose(file);
  return error_info->error_code;
}